

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 subFloatx80Sigs(floatx80 a,floatx80 b,flag zSign,float_status *status)

{
  floatx80 fVar1;
  floatx80 fVar2;
  int iVar3;
  ulong a0;
  ulong uVar4;
  uint64_t zSig0;
  uint uVar5;
  uint zExp;
  floatx80 fVar6;
  floatx80 a_00;
  uint64_t local_48;
  uint64_t bSig;
  uint64_t aSig;
  
  a0 = b.low;
  a_00.low = a.low;
  uVar4 = a._8_8_ & 0xffffffff;
  fVar6._8_8_ = uVar4;
  fVar6.low = a_00.low;
  uVar5 = a._8_4_ & 0x7fff;
  zExp = b._8_4_ & 0x7fff;
  iVar3 = uVar5 - zExp;
  bSig = a0;
  aSig = a_00.low;
  if (iVar3 == 0 || uVar5 < zExp) {
    if (iVar3 < 0) {
      if (zExp == 0x7fff) {
        if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
          fVar2._8_4_ = (uint)(byte)~zSign << 0xf | 0x7fff;
          fVar2.low = 0x8000000000000000;
          fVar2._12_4_ = 0;
          return fVar2;
        }
        goto LAB_00b1be85;
      }
      shift128RightJamming
                (a_00.low,0,
                 -iVar3 - (uint)(((undefined1  [16])a & (undefined1  [16])0x7fff) ==
                                (undefined1  [16])0x0),&aSig,&local_48);
    }
    else {
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
        zExp = 1;
        uVar5 = zExp;
      }
      else if (uVar5 == 0x7fff) {
        if (((a0 | a_00.low) & 0x7fffffffffffffff) == 0) {
          status->float_exception_flags = status->float_exception_flags | 1;
          fVar1._10_6_ = (int6)(uVar4 >> 0x10);
          fVar1.high = 0xffff;
          fVar1.low = 0xc000000000000000;
          return fVar1;
        }
        goto LAB_00b1be85;
      }
      if (a0 < a_00.low) {
        local_48 = 0;
        zExp = uVar5;
        goto LAB_00b1bf00;
      }
      if (a0 <= a_00.low) {
        return (floatx80)(ZEXT116(status->float_rounding_mode == '\x01') << 0x4f);
      }
      local_48 = 0;
    }
    zSig0 = (a0 - aSig) + -1 + (ulong)(local_48 == 0);
    zSign = zSign ^ 1;
  }
  else {
    if (uVar5 == 0x7fff) {
      if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
        return fVar6;
      }
LAB_00b1be85:
      a_00._8_8_ = a._8_8_ & 0xffffffff;
      fVar6 = propagateFloatx80NaN_tricore(a_00,b,status);
      return fVar6;
    }
    shift128RightJamming
              (a0,0,iVar3 - (uint)(((undefined1  [16])b & (undefined1  [16])0x7fff) ==
                                  (undefined1  [16])0x0),&bSig,&local_48);
    zExp = uVar5;
LAB_00b1bf00:
    zSig0 = (a_00.low - bSig) + -1 + (ulong)(local_48 == 0);
  }
  fVar6 = normalizeRoundAndPackFloatx80_tricore
                    (status->floatx80_rounding_precision,zSign,zExp,zSig0,-local_48,status);
  return fVar6;
}

Assistant:

static floatx80 subFloatx80Sigs(floatx80 a, floatx80 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    int32_t expDiff;

    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    expDiff = aExp - bExp;
    if ( 0 < expDiff ) goto aExpBigger;
    if ( expDiff < 0 ) goto bExpBigger;
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( ( aSig | bSig )<<1 ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    if ( aExp == 0 ) {
        aExp = 1;
        bExp = 1;
    }
    zSig1 = 0;
    if ( bSig < aSig ) goto aBigger;
    if ( aSig < bSig ) goto bBigger;
    return packFloatx80(status->float_rounding_mode == float_round_down, 0, 0);
 bExpBigger:
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return packFloatx80(zSign ^ 1, floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) ++expDiff;
    shift128RightJamming( aSig, 0, - expDiff, &aSig, &zSig1 );
 bBigger:
    sub128( bSig, 0, aSig, zSig1, &zSig0, &zSig1 );
    zExp = bExp;
    zSign ^= 1;
    goto normalizeRoundAndPack;
 aExpBigger:
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) --expDiff;
    shift128RightJamming( bSig, 0, expDiff, &bSig, &zSig1 );
 aBigger:
    sub128( aSig, 0, bSig, zSig1, &zSig0, &zSig1 );
    zExp = aExp;
 normalizeRoundAndPack:
    return normalizeRoundAndPackFloatx80(status->floatx80_rounding_precision,
                                         zSign, zExp, zSig0, zSig1, status);
}